

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_dirname(mcu8str *__return_storage_ptr__,mcu8str *pathraw)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  mcu8str_size_t prealloc_size;
  char *__src;
  uint uVar6;
  mcu8str path;
  mcu8str local_40;
  
  __src = pathraw->c_str;
  uVar6 = pathraw->size;
  local_40.buflen = uVar6 + 1;
  local_40.owns_memory = 0;
  local_40.c_str = __src;
  local_40.size = uVar6;
  iVar2 = mctools_impl_has_winnamespace(pathraw);
  if (iVar2 != 0) {
    __src = __src + 4;
    uVar6 = uVar6 - 4;
    local_40.c_str = __src;
    local_40.size = uVar6;
  }
  cVar1 = mctools_drive_letter(&local_40);
  pcVar3 = __src;
  if (cVar1 != '\0') {
    pcVar3 = __src + 2;
  }
  if (pcVar3 == __src + uVar6) {
LAB_00108436:
    if (cVar1 == '\0') {
      __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
      __return_storage_ptr__->size = 0;
      __return_storage_ptr__->buflen = 0;
      __return_storage_ptr__->owns_memory = 0;
      return __return_storage_ptr__;
    }
LAB_0010843b:
    mcu8str_create_from_cstr(__return_storage_ptr__,"::");
    *__return_storage_ptr__->c_str = cVar1;
  }
  else {
    pcVar4 = __src + uVar6;
    do {
      pcVar4 = pcVar4 + -1;
      pcVar5 = pcVar4;
      if (pcVar4 <= pcVar3) goto LAB_001083a8;
    } while ((*pcVar4 != '\\') && (*pcVar4 != '/'));
    do {
      if ((pcVar4[-1] != '\\') && (pcVar5 = pcVar4, pcVar4[-1] != '/')) break;
      pcVar4 = pcVar4 + -1;
      pcVar5 = pcVar3;
    } while (pcVar3 < pcVar4);
LAB_001083a8:
    if ((pcVar5 == pcVar3) && ((*pcVar3 == '\\' || (pcVar5 = pcVar3, *pcVar3 == '/')))) {
      pcVar5 = pcVar3 + 1;
    }
    prealloc_size = (long)pcVar5 - (long)pcVar3;
    if ((prealloc_size == 1) && (*pcVar3 == '.')) {
      if (cVar1 != '\0') goto LAB_0010843b;
    }
    else {
      if (pcVar5 != pcVar3) {
        if (cVar1 == '\0') {
          mcu8str_create(__return_storage_ptr__,prealloc_size);
          pcVar3 = __return_storage_ptr__->c_str;
          memcpy(pcVar3,__src,prealloc_size);
          pcVar3[prealloc_size] = '\0';
        }
        else {
          mcu8str_create(__return_storage_ptr__,prealloc_size + 2);
          pcVar3 = __return_storage_ptr__->c_str;
          *pcVar3 = cVar1;
          pcVar3[1] = ':';
          memcpy(pcVar3 + 2,__src + 2,prealloc_size);
          pcVar3[prealloc_size + 2] = '\0';
          prealloc_size = (mcu8str_size_t)((int)prealloc_size + 2);
        }
        __return_storage_ptr__->size = (uint)prealloc_size;
        mctools_pathseps_platform(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      if ((cVar1 != '\0') || (*__src != '.')) goto LAB_00108436;
    }
    mcu8str_create_from_cstr(__return_storage_ptr__,".");
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_dirname( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    char drive_letter = mctools_drive_letter( &path );
    const char * itB = path.c_str;
    const char * itE = path.c_str + path.size;
    if ( drive_letter )
      itB += 2;//ignore drive letter while analysing

    if ( itB == itE ) {
      //empty:
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }

    //Find last path sep, skipping consecutive separatorss:
    const char * it0 = itB;
    //const char * itB = ( drive_letter ? it0 + 2 : it0 );
    const char * it = (itE-1);//start at last

    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    //it is now at the last path sep:
    while ( it > itB && ( *(it-1)=='/' || *(it-1)=='\\' ) )
      --it;

    //If this turned a path starting with a path sep into an empty path, add
    //back a single slash (so that dirname("/")="/" and not ""):
    if ( it == itB && ( *it == '/' || *it == '\\' ) )
      ++it;

    //Apart from a potential drive_letter, the string at [it0,it) is now the
    //result:
    mcu8str_size_t ressize = (mcu8str_size_t)(it-it0);

    if ( ressize == 1 && *it0 == '.' ) {
      //special case, "." or "D:."
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_from_cstr(".");
      }
    }

    if ( ressize == 0 ) {
      if ( path.c_str[0] == '.' && !drive_letter )
        return mcu8str_create_from_cstr(".");
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }
    if ( drive_letter ) {
      mcu8str res = mcu8str_create( ressize + 2 );
      res.c_str[0] = drive_letter;
      res.c_str[1] = ':';
      STDNS memcpy( res.c_str + 2, it0, ressize );
      res.c_str[ressize+2] = '\0';
      res.size = (unsigned)ressize+2;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    } else {
      mcu8str res = mcu8str_create( ressize );
      STDNS memcpy( res.c_str, it0, ressize );
      res.c_str[ressize] = '\0';
      res.size = (unsigned)ressize;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    }
  }